

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

FuncDef * sqlite3VtabOverloadFunction(sqlite3 *db,FuncDef *pDef,int nArg,Expr *pExpr)

{
  Window *pWVar1;
  code *pcVar2;
  char *__s;
  undefined2 uVar3;
  u32 uVar4;
  int iVar5;
  FuncDef **ppFVar6;
  size_t sVar7;
  FuncDef *pFVar8;
  long lVar9;
  u64 n;
  FuncDef *pFVar10;
  FuncDef *pFVar11;
  long in_FS_OFFSET;
  byte bVar12;
  void *pArg;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc;
  void *local_30;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *local_28;
  long local_20;
  
  bVar12 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0;
  local_30 = (void *)0x0;
  if ((((pExpr != (Expr *)0x0) && (pExpr->op == 0xa8)) &&
      (pWVar1 = (pExpr->y).pWin, pWVar1 != (Window *)0x0)) &&
     (*(char *)((long)&pWVar1->ppThis + 7) == '\x01')) {
    ppFVar6 = &pWVar1->pWFunc;
    do {
      pFVar8 = *ppFVar6;
      ppFVar6 = (FuncDef **)&pFVar8->xValue;
    } while (*(sqlite3 **)pFVar8 != db);
    pcVar2 = *(code **)(*(long *)pFVar8->pNext + 0x90);
    if ((pcVar2 != (code *)0x0) &&
       (iVar5 = (*pcVar2)(pFVar8->pNext,nArg,pDef->zName,&local_28,&local_30), iVar5 != 0)) {
      if (pDef->zName == (char *)0x0) {
        n = 0x49;
      }
      else {
        sVar7 = strlen(pDef->zName);
        n = (ulong)((uint)sVar7 & 0x3fffffff) + 0x49;
      }
      pFVar8 = (FuncDef *)sqlite3DbMallocZero(db,n);
      if (pFVar8 != (FuncDef *)0x0) {
        pFVar10 = pDef;
        pFVar11 = pFVar8;
        for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
          uVar3 = *(undefined2 *)&pFVar10->field_0x2;
          uVar4 = pFVar10->funcFlags;
          pFVar11->nArg = pFVar10->nArg;
          *(undefined2 *)&pFVar11->field_0x2 = uVar3;
          pFVar11->funcFlags = uVar4;
          pFVar10 = (FuncDef *)((long)pFVar10 + (ulong)bVar12 * -0x10 + 8);
          pFVar11 = (FuncDef *)((long)pFVar11 + (ulong)bVar12 * -0x10 + 8);
        }
        pFVar8->zName = (char *)(pFVar8 + 1);
        __s = pDef->zName;
        if (__s == (char *)0x0) {
          sVar7 = 1;
        }
        else {
          sVar7 = strlen(__s);
          sVar7 = (ulong)((uint)sVar7 & 0x3fffffff) + 1;
        }
        memcpy(pFVar8 + 1,__s,sVar7);
        pFVar8->xSFunc = local_28;
        pFVar8->pUserData = local_30;
        *(byte *)&pFVar8->funcFlags = (byte)pFVar8->funcFlags | 0x10;
        pDef = pFVar8;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return pDef;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3VtabOverloadFunction(
  sqlite3 *db,    /* Database connection for reporting malloc problems */
  FuncDef *pDef,  /* Function to possibly overload */
  int nArg,       /* Number of arguments to the function */
  Expr *pExpr     /* First argument to the function */
){
  Table *pTab;
  sqlite3_vtab *pVtab;
  sqlite3_module *pMod;
  void (*xSFunc)(sqlite3_context*,int,sqlite3_value**) = 0;
  void *pArg = 0;
  FuncDef *pNew;
  int rc = 0;

  /* Check to see the left operand is a column in a virtual table */
  if( NEVER(pExpr==0) ) return pDef;
  if( pExpr->op!=TK_COLUMN ) return pDef;
  assert( ExprUseYTab(pExpr) );
  pTab = pExpr->y.pTab;
  if( NEVER(pTab==0) ) return pDef;
  if( !IsVirtual(pTab) ) return pDef;
  pVtab = sqlite3GetVTable(db, pTab)->pVtab;
  assert( pVtab!=0 );
  assert( pVtab->pModule!=0 );
  pMod = (sqlite3_module *)pVtab->pModule;
  if( pMod->xFindFunction==0 ) return pDef;

  /* Call the xFindFunction method on the virtual table implementation
  ** to see if the implementation wants to overload this function.
  **
  ** Though undocumented, we have historically always invoked xFindFunction
  ** with an all lower-case function name.  Continue in this tradition to
  ** avoid any chance of an incompatibility.
  */
#ifdef SQLITE_DEBUG
  {
    int i;
    for(i=0; pDef->zName[i]; i++){
      unsigned char x = (unsigned char)pDef->zName[i];
      assert( x==sqlite3UpperToLower[x] );
    }
  }
#endif
  rc = pMod->xFindFunction(pVtab, nArg, pDef->zName, &xSFunc, &pArg);
  if( rc==0 ){
    return pDef;
  }

  /* Create a new ephemeral function definition for the overloaded
  ** function */
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew)
                             + sqlite3Strlen30(pDef->zName) + 1);
  if( pNew==0 ){
    return pDef;
  }
  *pNew = *pDef;
  pNew->zName = (const char*)&pNew[1];
  memcpy((char*)&pNew[1], pDef->zName, sqlite3Strlen30(pDef->zName)+1);
  pNew->xSFunc = xSFunc;
  pNew->pUserData = pArg;
  pNew->funcFlags |= SQLITE_FUNC_EPHEM;
  return pNew;
}